

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O3

Vec_Ptr_t * Llb_ManCutSupps(Aig_Man_t *p,Vec_Ptr_t *vResult)

{
  Vec_Ptr_t *vUpper;
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  void *pvVar3;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  
  pVVar1 = (Vec_Ptr_t *)malloc(0x10);
  pVVar1->nCap = 100;
  ppvVar2 = (void **)malloc(800);
  pVVar1->pArray = ppvVar2;
  pvVar3 = calloc(1,0x10);
  pVVar1->nSize = 1;
  *ppvVar2 = pvVar3;
  if (vResult->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  lVar5 = 1;
  iVar6 = 1;
  if (vResult->nSize != 1) {
    lVar5 = 1;
    uVar7 = 100;
    iVar8 = 2;
    pVVar4 = (Vec_Ptr_t *)*vResult->pArray;
    do {
      vUpper = (Vec_Ptr_t *)vResult->pArray[lVar5];
      pVVar4 = Llb_ManCutSupp(p,pVVar4,vUpper);
      iVar6 = (int)uVar7;
      if ((int)lVar5 == iVar6) {
        if (iVar6 < 0x10) {
          if (pVVar1->pArray == (void **)0x0) {
            ppvVar2 = (void **)malloc(0x80);
          }
          else {
            ppvVar2 = (void **)realloc(pVVar1->pArray,0x80);
          }
          pVVar1->pArray = ppvVar2;
          pVVar1->nCap = 0x10;
          uVar7 = 0x10;
        }
        else {
          uVar7 = (ulong)(uint)(iVar6 * 2);
          if (pVVar1->pArray == (void **)0x0) {
            ppvVar2 = (void **)malloc(uVar7 * 8);
          }
          else {
            ppvVar2 = (void **)realloc(pVVar1->pArray,uVar7 * 8);
          }
          pVVar1->pArray = ppvVar2;
          pVVar1->nCap = iVar6 * 2;
        }
      }
      else {
        ppvVar2 = pVVar1->pArray;
      }
      pVVar1->nSize = iVar8;
      ppvVar2[lVar5] = pVVar4;
      lVar5 = lVar5 + 1;
      iVar6 = vResult->nSize;
      iVar8 = iVar8 + 1;
      pVVar4 = vUpper;
    } while (lVar5 < iVar6);
  }
  if ((int)lVar5 == iVar6) {
    return pVVar1;
  }
  __assert_fail("Vec_PtrSize(vSupps) == Vec_PtrSize(vResult)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                ,0x4a,"Vec_Ptr_t *Llb_ManCutSupps(Aig_Man_t *, Vec_Ptr_t *)");
}

Assistant:

Vec_Ptr_t * Llb_ManCutSupps( Aig_Man_t * p, Vec_Ptr_t * vResult )
{
    Vec_Ptr_t * vSupps, * vOne, * vLower, * vUpper;
    int i;
    vSupps = Vec_PtrAlloc( 100 );
    Vec_PtrPush( vSupps, Vec_PtrAlloc(0) );
    vLower = (Vec_Ptr_t *)Vec_PtrEntry( vResult, 0 );
    Vec_PtrForEachEntryStart( Vec_Ptr_t *, vResult, vUpper, i, 1 )
    {
        vOne  = Llb_ManCutSupp( p, vLower, vUpper );
        Vec_PtrPush( vSupps, vOne );
        vLower = vUpper;
    }
    assert( Vec_PtrSize(vSupps) == Vec_PtrSize(vResult) );
    return vSupps;
}